

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_DDict *
ZSTD_createDDict_advanced
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  uint uVar1;
  size_t code;
  ZSTD_dictContentType_e in_ECX;
  ZSTD_dictLoadMethod_e in_EDX;
  ZSTD_DDict *in_RSI;
  void *in_RDI;
  size_t in_stack_00000008;
  long in_stack_00000010;
  ZSTD_DDict *ddict;
  undefined8 *puVar2;
  undefined8 in_stack_ffffffffffffffd8;
  ZSTD_DDict *in_stack_fffffffffffffff8;
  ZSTD_DDict *pZVar3;
  
  puVar2 = &stack0x00000008;
  if ((in_stack_00000008 == 0) == (in_stack_00000010 == 0)) {
    customMem_00.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffd8;
    customMem_00.customAlloc = (ZSTD_allocFunction)puVar2;
    customMem_00.opaque._0_4_ = in_ECX;
    customMem_00.opaque._4_4_ = in_EDX;
    pZVar3 = (ZSTD_DDict *)ZSTD_malloc(in_stack_00000008,customMem_00);
    if (pZVar3 == (ZSTD_DDict *)0x0) {
      pZVar3 = (ZSTD_DDict *)0x0;
    }
    else {
      (pZVar3->cMem).customAlloc = (ZSTD_allocFunction)*puVar2;
      (pZVar3->cMem).customFree = (ZSTD_freeFunction)puVar2[1];
      (pZVar3->cMem).opaque = (void *)puVar2[2];
      code = ZSTD_initDDict_internal(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI,in_EDX,in_ECX);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        ZSTD_freeDDict(in_RSI);
        pZVar3 = (ZSTD_DDict *)0x0;
      }
    }
  }
  else {
    pZVar3 = (ZSTD_DDict *)0x0;
  }
  return pZVar3;
}

Assistant:

ZSTD_DDict* ZSTD_createDDict_advanced(const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_customMem customMem)
{
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   ZSTD_DDict* const ddict = (ZSTD_DDict*) ZSTD_malloc(sizeof(ZSTD_DDict), customMem);
        if (!ddict) return NULL;
        ddict->cMem = customMem;

        if (ZSTD_isError( ZSTD_initDDict_internal(ddict, dict, dictSize, dictLoadMethod, dictContentType) )) {
            ZSTD_freeDDict(ddict);
            return NULL;
        }

        return ddict;
    }
}